

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O3

sexp_conflict
sexp_recvfrom(sexp_conflict ctx,sexp_conflict self,int sock,void *buffer,size_t len,int flags,
             sockaddr *addr,socklen_t addr_len,sexp_conflict timeout)

{
  sexp_conflict *ppsVar1;
  sexp_conflict psVar2;
  ssize_t sVar3;
  int *piVar4;
  
  sVar3 = recvfrom(sock,buffer,len,flags,(sockaddr *)addr,&addr_len);
  psVar2 = timeout;
  if (((((sVar3 < 0) && (piVar4 = __errno_location(), psVar2 != (sexp_conflict)0x1)) &&
       (*piVar4 == 0xb)) &&
      (((((ulong)psVar2 & 3) != 0 || (psVar2->tag != 0xb)) ||
       (((psVar2->value).flonum != 0.0 || (NAN((psVar2->value).flonum))))))) &&
     ((ppsVar1 = (((ctx->value).type.setters)->value).context.mark_stack[0xc].start,
      ((ulong)ppsVar1 & 3) == 0 && ((*(int *)ppsVar1 == 0x1b || (*(int *)ppsVar1 == 0x14)))))) {
    sexp_apply2(ctx,ppsVar1,(long)sock * 2 + 1,psVar2);
    return (sexp_conflict)(((ctx->value).type.setters)->value).context.mark_stack[8].prev;
  }
  return (sexp_conflict)(sVar3 * 2 + 1);
}

Assistant:

sexp sexp_recvfrom (sexp ctx, sexp self, int sock, void* buffer, size_t len, int flags, struct sockaddr* addr, socklen_t addr_len, sexp timeout) {
#if SEXP_USE_GREEN_THREADS
  sexp f;
#endif
  ssize_t res;
  res = recvfrom(sock, buffer, len, flags, addr, &addr_len);
#if SEXP_USE_GREEN_THREADS
  if (res < 0 && errno == EWOULDBLOCK && !sexp_zerop(timeout)) {
    f = sexp_global(ctx, SEXP_G_THREADS_BLOCKER);
    if (sexp_applicablep(f)) {
      sexp_apply2(ctx, f, sexp_make_fixnum(sock), timeout);
      return sexp_global(ctx, SEXP_G_IO_BLOCK_ONCE_ERROR);
    }
  }
#endif
  return sexp_make_fixnum(res);
}